

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatLibraryPy.cpp
# Opt level: O3

void init_module_MatLibraryPy(void)

{
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar1;
  long lVar2;
  class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar3;
  undefined1 local_b9;
  long *local_b8;
  undefined1 local_a9;
  long *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_88.m_keywords.second = (keyword *)0x0;
  local_88.m_doc = (char *)0x0;
  local_88.m_keywords.first = (keyword *)0x0;
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_b8,"Matrix",&local_88);
  local_18 = 0;
  local_28 = 0;
  uStack_20 = 0;
  boost::python::detail::define_class_init_helper<0>::
  apply<boost::python::class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector2<int,int>,boost::mpl::size<boost::mpl::vector2<int,int>>>
            ((class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_b8,&local_48,&local_a8,0);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  boost::python::detail::define_class_init_helper<0>::
  apply<boost::python::class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector1<boost::python::list>,boost::mpl::size<boost::mpl::vector1<boost::python::list>>>
            (&local_b8,&local_a8,&local_68,0);
  local_a8 = (long *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  boost::python::detail::define_class_init_helper<0>::
  apply<boost::python::class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector1<std::__cxx11::string>,boost::mpl::size<boost::mpl::vector1<std::__cxx11::string>>>
            (&local_b8,&local_68,&local_b9,0);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  boost::python::detail::define_class_init_helper<0>::
  apply<boost::python::class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector1<mat_lib::matrix<double>>,boost::mpl::size<boost::mpl::vector1<mat_lib::matrix<double>>>>
            (&local_b8,&local_b9,&local_a9,0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::matrix<double>::*)()const>
                        ((class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_b8,"__str__",(first_type)mat_lib::matrix<double>::str_abi_cxx11_)
  ;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"__repr__",(first_type)mat_lib::matrix<double>::repr_abi_cxx11_);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,mat_lib::matrix<double>const&)>
            (pcVar1,"__add__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)0>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,mat_lib::matrix<double>const&)>
            (pcVar1,"__sub__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)1>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,double_const&)>
            (pcVar1,"__truediv__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)40>::
             apply<mat_lib::matrix<double>,_double>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,double_const&)>
            (pcVar1,"__rtruediv__",
             boost::python::detail::operator_r<(boost::python::detail::operator_id)40>::
             apply<double,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,mat_lib::matrix<double>const&)>
            (pcVar1,"__mul__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)2>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<_object*(*)(boost::python::back_reference<mat_lib::matrix<double>&>,mat_lib::matrix<double>const&)>
            (pcVar1,"__iadd__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)27>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<_object*(*)(boost::python::back_reference<mat_lib::matrix<double>&>,mat_lib::matrix<double>const&)>
            (pcVar1,"__isub__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)28>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<_object*(*)(mat_lib::matrix<double>&,mat_lib::matrix<double>const&)>
            (pcVar1,"__eq__",
             boost::python::detail::operator_l<(boost::python::detail::operator_id)25>::
             apply<mat_lib::matrix<double>,_mat_lib::matrix<double>_>::execute);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"size",(first_type)mat_lib::matrix<double>::size);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"rows",(first_type)mat_lib::matrix<double>::rows);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"columns",(first_type)mat_lib::matrix<double>::columns);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<double(mat_lib::matrix<double>::*)(unsigned_long,unsigned_long)const>
                        (pcVar1,"get",(first_type)mat_lib::matrix<double>::get);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::matrix<double>::*)(unsigned_long,unsigned_long,double)>
                        (pcVar1,"set",(first_type)mat_lib::matrix<double>::set);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<mat_lib::matrix<double>(mat_lib::matrix<double>::*)()>
                        (pcVar1,"inv",(first_type)mat_lib::matrix<double>::inverse);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<mat_lib::matrix<double>(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"transpose",(first_type)mat_lib::matrix<double>::make_transpose);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::base_matrix<double>::*)(int)>
                        (pcVar1,"setFractionalDigits",
                         (first_type)mat_lib::base_matrix<double>::setFractionalDigits);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::base_matrix<double>::*)(mat_lib::format)>
                        (pcVar1,"setFormat",(first_type)mat_lib::base_matrix<double>::setFormat);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(mat_lib::matrix<double>::*)(std::__cxx11::string_const&)const>
            (pcVar1,"saveAs",(first_type)mat_lib::matrix<double>::save_as);
  if (0 < *local_b8) {
    lVar2 = *local_b8 + -1;
    *local_b8 = lVar2;
    if (lVar2 == 0) {
      _Py_Dealloc();
    }
    local_88.m_keywords.second = (keyword *)0x0;
    local_88.m_doc = (char *)0x0;
    local_88.m_keywords.first = (keyword *)0x0;
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::
    class_<boost::python::init<int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
              ((class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                *)&local_a8,"Vector",
               (init_base<boost::python::init<int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                *)&local_88);
    local_18 = 0;
    local_28 = 0;
    uStack_20 = 0;
    boost::python::detail::define_class_init_helper<0>::
    apply<boost::python::class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector1<boost::python::list>,boost::mpl::size<boost::mpl::vector1<boost::python::list>>>
              ((class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                *)&local_a8,&local_48,&local_68,0);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    boost::python::detail::define_class_init_helper<0>::
    apply<boost::python::class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector1<std::__cxx11::string>,boost::mpl::size<boost::mpl::vector1<std::__cxx11::string>>>
              (&local_a8,&local_68,&local_b8,0);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<std::__cxx11::string(mat_lib::vector<double>::*)()const>
                          ((class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                            *)&local_a8,"__str__",
                           (first_type)mat_lib::vector<double>::str_abi_cxx11_);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<std::__cxx11::string(mat_lib::vector<double>::*)()const>
                          (pcVar3,"__repr__",(first_type)mat_lib::vector<double>::repr_abi_cxx11_);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)(std::__cxx11::string_const&)const>
                          (pcVar3,"saveAs",(first_type)mat_lib::vector<double>::save_as);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<unsigned_long(mat_lib::vector<double>::*)()const>
                          (pcVar3,"size",(first_type)mat_lib::vector<double>::size);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)()>
                          (pcVar3,"random",(first_type)mat_lib::vector<double>::define_random);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)(int)>
                          (pcVar3,"define",(first_type)mat_lib::vector<double>::define_value);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<bool(mat_lib::vector<double>::*)()const>
                          (pcVar3,"isEmpty",(first_type)mat_lib::vector<double>::is_empty);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)(unsigned_long,double)>
                          (pcVar3,"set",(first_type)mat_lib::vector<double>::set);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<double(mat_lib::vector<double>::*)(unsigned_long)>
                          (pcVar3,"get",(first_type)mat_lib::vector<double>::get);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)(int)>
                          (pcVar3,"setFractionalDigits",
                           (first_type)mat_lib::vector<double>::setFractionalDigits);
    pcVar3 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)boost::python::
                class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                ::def<void(mat_lib::vector<double>::*)(mat_lib::format)>
                          (pcVar3,"setFormat",(first_type)mat_lib::vector<double>::setFormat);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__add__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)0>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,double_const&)>
              (pcVar3,"__add__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)0>::
               apply<mat_lib::vector<double>,_double>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__sub__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)1>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,double_const&)>
              (pcVar3,"__sub__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)1>::
               apply<mat_lib::vector<double>,_double>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__mul__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)2>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,double_const&)>
              (pcVar3,"__mul__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)2>::
               apply<mat_lib::vector<double>,_double>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__truediv__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)40>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,double_const&)>
              (pcVar3,"__truediv__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)40>::
               apply<mat_lib::vector<double>,_double>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::
    def<_object*(*)(boost::python::back_reference<mat_lib::vector<double>&>,mat_lib::vector<double>const&)>
              (pcVar3,"__iadd__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)27>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::
    def<_object*(*)(boost::python::back_reference<mat_lib::vector<double>&>,mat_lib::vector<double>const&)>
              (pcVar3,"__isub__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)28>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__eq__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)25>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::
    def<_object*(*)(boost::python::back_reference<mat_lib::vector<double>&>,mat_lib::vector<double>const&)>
              (pcVar3,"__idiv__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)30>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    boost::python::
    class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
    ::def<_object*(*)(mat_lib::vector<double>&,mat_lib::vector<double>const&)>
              (pcVar3,"__ne__",
               boost::python::detail::operator_l<(boost::python::detail::operator_id)26>::
               apply<mat_lib::vector<double>,_mat_lib::vector<double>_>::execute);
    if (0 < *local_a8) {
      lVar2 = *local_a8 + -1;
      *local_a8 = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      boost::python::objects::enum_base::enum_base
                ((enum_base *)&local_88,"Format",boost::python::enum_<mat_lib::format>::to_python,
                 boost::python::enum_<mat_lib::format>::convertible_from_python,
                 boost::python::enum_<mat_lib::format>::construct,(type_info)"N7mat_lib6formatE",
                 (char *)0x0);
      boost::python::objects::enum_base::add_value((char *)&local_88,0x1571d7);
      boost::python::objects::enum_base::add_value((char *)&local_88,0x1571dd);
      boost::python::objects::enum_base::export_values();
      if (0 < *(long *)local_88.m_doc) {
        lVar2 = *(long *)local_88.m_doc + -1;
        *(long *)local_88.m_doc = lVar2;
        if (lVar2 == 0) {
          _Py_Dealloc();
        }
        return;
      }
    }
  }
  __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                "boost::python::api::object_base::~object_base()");
}

Assistant:

BOOST_PYTHON_MODULE(MatLibraryPy)
{
    class_<matrix<double>>("Matrix", init<>())
        .def(init<int,int>())
        .def(init<boost::python::list>())
        .def(init<string>())
        .def(init<matrix<double>>())
        .def("__str__", &matrix<double>::str)
        .def("__repr__", &matrix<double>::repr)
        .def(self + matrix<double>())
        .def(self - matrix<double>())
        .def(self  / double())
        .def(double() / self)
        .def(self * matrix<double>())
        .def(self += matrix<double>())
        .def(self -= matrix<double>())
        .def(self == matrix<double>())
        .def("size", &matrix<double>::size)
        .def("rows", &matrix<double>::rows)
        .def("columns", &matrix<double>::columns)
        .def("get", &matrix<double>::get)
        .def("set", &matrix<double>::set)
        .def("inv", &matrix<double>::inverse)
        .def("transpose", &matrix<double>::make_transpose)
        .def("setFractionalDigits", &matrix<double>::setFractionalDigits)
        .def("setFormat", &matrix<double>::setFormat)
        .def("saveAs", &matrix<double>::save_as)
    ;

    class_<mat_lib::vector<double>>("Vector", init<int>())
        .def(init<boost::python::list>())
        .def(init<string>())
        .def("__str__", &mat_lib::vector<double>::str)
        .def("__repr__", &mat_lib::vector<double>::repr)
        .def("saveAs", &mat_lib::vector<double>::save_as)
        .def("size", &mat_lib::vector<double>::size)
        .def("random", &mat_lib::vector<double>::define_random)
        .def("define", &mat_lib::vector<double>::define_value)
        .def("isEmpty", &mat_lib::vector<double>::is_empty)
        .def("set", &mat_lib::vector<double>::set)
        .def("get", &mat_lib::vector<double>::get)
        .def("setFractionalDigits", &mat_lib::vector<double>::setFractionalDigits)
        .def("setFormat", &mat_lib::vector<double>::setFormat)
        .def(self + mat_lib::vector<double>())
        .def(self + double())
        .def(self - mat_lib::vector<double>())
        .def(self - double())
        .def(self * mat_lib::vector<double>())
        .def(self * double())
        .def(self / mat_lib::vector<double>())
        .def(self / double())
        .def(self += mat_lib::vector<double>())
        .def(self -= mat_lib::vector<double>())
        .def(self == mat_lib::vector<double>())
        .def(self /= mat_lib::vector<double>())
        .def(self != mat_lib::vector<double>())
    ;

    enum_<format>("Format")
        .value("fixed", mat_lib::fixed)
        .value("scientific", mat_lib::scientific)
        .export_values()
    ;
}